

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O1

void testRgbaThreading(string *tempDir)

{
  pointer pcVar1;
  double dVar2;
  void *pvVar3;
  char cVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  int iVar10;
  LineOrder in_R9D;
  long lVar11;
  int i;
  long lVar12;
  int lorder;
  long lVar13;
  Array2D<Imf_3_2::Rgba> *p1_00;
  RgbaChannels channels;
  float fVar14;
  float fVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Array2D<Imf_3_2::Rgba> p1;
  Compression in_stack_ffffffffffffff68;
  long *local_90 [2];
  long local_80 [2];
  double local_70;
  undefined8 local_68;
  long local_60;
  void *local_58;
  long local_50;
  double local_48;
  double local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing setGlobalThreadCount()",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  cVar4 = IlmThread_3_2::supportsThreads();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Threading not supported!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    plVar8 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  else {
    iVar10 = 0;
    uVar7 = 0;
    do {
      fVar14 = (float)Imath_3_2::Rand32::nextf();
      Imf_3_2::setGlobalThreadCount((int)(fVar14 * 32.0 + 0.5));
      if ((int)(uVar7 / 2000) * -2000 == iVar10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        std::ostream::flush();
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      iVar10 = iVar10 + -1;
    } while (iVar10 != -10000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nok\n",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Testing multi-threaded writing of scanlines\nin random-sized blocks",0x42);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    local_68 = 0x77;
    local_60 = 0xed;
    local_58 = operator_new__(0x37158);
    lVar13 = 0;
    lVar11 = 0;
    do {
      local_38 = (double)(int)lVar11;
      local_40 = local_38 * 0.1;
      local_48 = local_38 * 0.2;
      local_38 = local_38 * 0.3;
      lVar12 = 0;
      local_50 = lVar11;
      do {
        pvVar3 = local_58;
        lVar11 = local_60;
        local_70 = (double)(int)lVar12;
        dVar2 = sin(local_70 * 0.1 + local_40);
        fVar15 = (float)(dVar2 * 0.5 + 0.5);
        fVar14 = ABS(fVar15);
        uVar5 = (ushort)((uint)fVar15 >> 0x10) & 0x8000;
        if ((uint)fVar14 < 0x38800000) {
          if ((0x33000000 < (uint)fVar14) &&
             (uVar6 = (uint)fVar14 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar14 >> 0x17),
             uVar5 = uVar5 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
             0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
            uVar5 = uVar5 + 1;
          }
        }
        else if ((uint)fVar14 < 0x7f800000) {
          if ((uint)fVar14 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar14 + 0x8000fff + (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar14 != INFINITY) {
            uVar6 = (uint)fVar14 >> 0xd & 0x3ff;
            uVar5 = uVar5 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        lVar11 = lVar11 * lVar13;
        *(ushort *)((long)pvVar3 + lVar12 * 8 + lVar11) = uVar5;
        dVar2 = sin(local_70 * 0.1 + local_48);
        fVar15 = (float)(dVar2 * 0.5 + 0.5);
        fVar14 = ABS(fVar15);
        uVar5 = (ushort)((uint)fVar15 >> 0x10) & 0x8000;
        if ((uint)fVar14 < 0x38800000) {
          if ((0x33000000 < (uint)fVar14) &&
             (uVar6 = (uint)fVar14 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar14 >> 0x17),
             uVar5 = uVar5 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
             0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
            uVar5 = uVar5 + 1;
          }
        }
        else if ((uint)fVar14 < 0x7f800000) {
          if ((uint)fVar14 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar14 + 0x8000fff + (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar14 != INFINITY) {
            uVar6 = (uint)fVar14 >> 0xd & 0x3ff;
            uVar5 = uVar5 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        *(ushort *)((long)pvVar3 + lVar12 * 8 + lVar11 + 2) = uVar5;
        dVar2 = sin(local_70 * 0.1 + local_38);
        fVar15 = (float)(dVar2 * 0.5 + 0.5);
        fVar14 = ABS(fVar15);
        uVar6 = (uint)fVar15 >> 0x10 & 0x8000;
        if ((uint)fVar14 < 0x38800000) {
          if ((0x33000000 < (uint)fVar14) &&
             (uVar9 = (uint)fVar14 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar14 >> 0x17),
             uVar6 = uVar6 | uVar9 >> (0x7eU - cVar4 & 0x1f),
             0x80000000 < uVar9 << (cVar4 + 0xa2U & 0x1f))) {
            uVar6 = uVar6 + 1;
          }
        }
        else if ((uint)fVar14 < 0x7f800000) {
          if ((uint)fVar14 < 0x477ff000) {
            uVar6 = (int)fVar14 + 0x8000fff + (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd | uVar6;
          }
          else {
            uVar6 = uVar6 | 0x7c00;
          }
        }
        else {
          uVar6 = uVar6 | 0x7c00;
          if (fVar14 != INFINITY) {
            uVar9 = (uint)fVar14 >> 0xd & 0x3ff;
            uVar6 = uVar6 | uVar9 | (uint)(uVar9 == 0);
          }
        }
        *(short *)((long)pvVar3 + lVar12 * 8 + lVar11 + 4) = (short)uVar6;
        fVar15 = (*(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar3 + lVar12 * 8 + lVar11) * 4) +
                  *(float *)(_imath_half_to_float_table + (ulong)(uVar6 & 0xffff) * 4) +
                 *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)pvVar3 + lVar12 * 8 + lVar11 + 2) * 4)) / 3.0;
        fVar14 = ABS(fVar15);
        uVar5 = (ushort)((uint)fVar15 >> 0x10) & 0x8000;
        if ((uint)fVar14 < 0x38800000) {
          if ((0x33000000 < (uint)fVar14) &&
             (uVar6 = (uint)fVar14 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar14 >> 0x17),
             uVar5 = uVar5 | (ushort)(uVar6 >> (0x7eU - cVar4 & 0x1f)),
             0x80000000 < uVar6 << (cVar4 + 0xa2U & 0x1f))) {
            uVar5 = uVar5 + 1;
          }
        }
        else if ((uint)fVar14 < 0x7f800000) {
          if ((uint)fVar14 < 0x477ff000) {
            uVar5 = (ushort)((int)fVar14 + 0x8000fff + (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar5;
          }
          else {
            uVar5 = uVar5 | 0x7c00;
          }
        }
        else {
          uVar5 = uVar5 | 0x7c00;
          if (fVar14 != INFINITY) {
            uVar6 = (uint)fVar14 >> 0xd & 0x3ff;
            uVar5 = uVar5 | (ushort)uVar6 | (ushort)(uVar6 == 0);
          }
        }
        *(ushort *)((long)pvVar3 + lVar12 * 8 + lVar11 + 6) = uVar5;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0xed);
      lVar11 = local_50 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar11 != 0x77);
    uVar7 = 0;
    do {
      local_70 = (double)uVar7;
      Imf_3_2::setGlobalThreadCount((int)uVar7 * 3 & 7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"number of threads: ",0x13);
      iVar10 = Imf_3_2::globalThreadCount();
      plVar8 = (long *)std::ostream::operator<<(&std::cout,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      channels = 0;
      do {
        p1_00 = (Array2D<Imf_3_2::Rgba> *)0x0;
        do {
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)local_90);
          iVar10 = (int)&local_68;
          anon_unknown.dwarf_2c557e::writeReadRGBA
                    ((char *)local_90[0],iVar10,0xf,p1_00,channels,in_R9D,in_stack_ffffffffffffff68)
          ;
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)local_90);
          anon_unknown.dwarf_2c557e::writeReadRGBA
                    ((char *)local_90[0],iVar10,7,p1_00,channels,in_R9D,in_stack_ffffffffffffff68);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)local_90);
          anon_unknown.dwarf_2c557e::writeReadRGBA
                    ((char *)local_90[0],iVar10,8,p1_00,channels,in_R9D,in_stack_ffffffffffffff68);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          pcVar1 = (tempDir->_M_dataplus)._M_p;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + tempDir->_M_string_length);
          std::__cxx11::string::append((char *)local_90);
          anon_unknown.dwarf_2c557e::writeReadRGBA
                    ((char *)local_90[0],iVar10,5,p1_00,channels,in_R9D,in_stack_ffffffffffffff68);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          uVar6 = (int)p1_00 + 1;
          p1_00 = (Array2D<Imf_3_2::Rgba> *)(ulong)uVar6;
        } while (uVar6 == 1);
        channels = channels + WRITE_R;
      } while (channels != (WRITE_A|WRITE_G));
      uVar6 = SUB84(local_70,0) + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (local_58 != (void *)0x0) {
      operator_delete__(local_58);
    }
  }
  return;
}

Assistant:

void
testRgbaThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing setGlobalThreadCount()" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

        for (int i = 0; i < 10000; i++)
        {
            int numThreads = int (rand1.nextf () * 32 + 0.5f);
            setGlobalThreadCount (numThreads);

            if (i % 2000 == 0) cout << "." << flush;
        }

        cout << "\nok\n" << endl;

        cout << "Testing multi-threaded writing of scanlines\n"
                "in random-sized blocks"
             << endl;

        const int W = 237;
        const int H = 119;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
                {
                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGBA,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGB,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_A,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        RgbaChannels (WRITE_R | WRITE_B),
                        LineOrder (lorder),
                        Compression (comp));
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}